

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall google::LogMessage::WriteToStringAndLog(LogMessage *this)

{
  LogMessageData *pLVar1;
  LogSink *pLVar2;
  
  pLVar1 = this->data_;
  pLVar2 = (pLVar1->field_6).sink_;
  if (pLVar2 != (LogSink *)0x0) {
    if ((pLVar1->num_chars_to_log_ == 0) ||
       (pLVar1->message_text_[pLVar1->num_chars_to_log_ - 1] != '\n')) {
      RawLog__(FATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
               ,0x779,"Check %s failed: %s",
               "data_->num_chars_to_log_ > 0 && data_->message_text_[data_->num_chars_to_log_ - 1] == \'\\n\'"
               ,"");
      pLVar1 = this->data_;
      pLVar2 = (pLVar1->field_6).sink_;
    }
    std::__cxx11::string::assign
              ((char *)pLVar2,(ulong)(pLVar1->message_text_ + pLVar1->num_prefix_chars_));
  }
  SendToLog(this);
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  if (data_->message_ != nullptr) {
    RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
                   data_->message_text_[data_->num_chars_to_log_ - 1] == '\n',
               "");
    // Omit prefix of message and trailing newline when writing to message_.
    const char* start = data_->message_text_ + data_->num_prefix_chars_;
    size_t len = data_->num_chars_to_log_ - data_->num_prefix_chars_ - 1;
    data_->message_->assign(start, len);
  }
  SendToLog();
}